

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::report_system_error(int error_code,string_view message)

{
  size_t in_R8;
  string_view message_00;
  int error_code_local;
  string_view message_local;
  
  message_00.size_ = in_R8;
  message_00.data_ = (char *)message.size_;
  anon_unknown_9::report_error
            ((anon_unknown_9 *)format_system_error,(FormatFunc)(ulong)(uint)error_code,
             (int)message.data_,message_00);
  return;
}

Assistant:

FMT_FUNC void report_system_error(
    int error_code, fmt::string_view message) FMT_NOEXCEPT {
  report_error(format_system_error, error_code, message);
}